

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_setup(mbedtls_md_context_t *ctx,mbedtls_md_info_t *md_info,int hmac)

{
  int iVar1;
  mbedtls_sha256_context *ctx_00;
  mbedtls_sha512_context *ctx_01;
  mbedtls_ripemd160_context *ctx_02;
  mbedtls_md5_context *ctx_03;
  mbedtls_sha1_context *ctx_04;
  void *pvVar2;
  
  iVar1 = -0x5100;
  if (ctx == (mbedtls_md_context_t *)0x0 || md_info == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  switch(md_info->type) {
  case MBEDTLS_MD_MD5:
    ctx_03 = (mbedtls_md5_context *)calloc(1,0x58);
    ctx->md_ctx = ctx_03;
    if (ctx_03 != (mbedtls_md5_context *)0x0) {
      mbedtls_md5_init(ctx_03);
LAB_001257f0:
      if (hmac == 0) {
LAB_0012580c:
        ctx->md_info = md_info;
        return 0;
      }
      pvVar2 = calloc(2,(ulong)md_info->block_size);
      ctx->hmac_ctx = pvVar2;
      if (pvVar2 != (void *)0x0) goto LAB_0012580c;
      mbedtls_md_free(ctx);
    }
    break;
  case MBEDTLS_MD_SHA1:
    ctx_04 = (mbedtls_sha1_context *)calloc(1,0x5c);
    ctx->md_ctx = ctx_04;
    if (ctx_04 != (mbedtls_sha1_context *)0x0) {
      mbedtls_sha1_init(ctx_04);
      goto LAB_001257f0;
    }
    break;
  case MBEDTLS_MD_SHA224:
  case MBEDTLS_MD_SHA256:
    ctx_00 = (mbedtls_sha256_context *)calloc(1,0x6c);
    ctx->md_ctx = ctx_00;
    if (ctx_00 != (mbedtls_sha256_context *)0x0) {
      mbedtls_sha256_init(ctx_00);
      goto LAB_001257f0;
    }
    break;
  case MBEDTLS_MD_SHA384:
  case MBEDTLS_MD_SHA512:
    ctx_01 = (mbedtls_sha512_context *)calloc(1,0xd8);
    ctx->md_ctx = ctx_01;
    if (ctx_01 != (mbedtls_sha512_context *)0x0) {
      mbedtls_sha512_init(ctx_01);
      goto LAB_001257f0;
    }
    break;
  case MBEDTLS_MD_RIPEMD160:
    ctx_02 = (mbedtls_ripemd160_context *)calloc(1,0x5c);
    ctx->md_ctx = ctx_02;
    if (ctx_02 != (mbedtls_ripemd160_context *)0x0) {
      mbedtls_ripemd160_init(ctx_02);
      goto LAB_001257f0;
    }
    break;
  default:
    goto switchD_0012573b_default;
  }
  iVar1 = -0x5180;
switchD_0012573b_default:
  return iVar1;
}

Assistant:

int mbedtls_md_setup( mbedtls_md_context_t *ctx, const mbedtls_md_info_t *md_info, int hmac )
{
    if( md_info == NULL || ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    switch( md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            ALLOC( md2 );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            ALLOC( md4 );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            ALLOC( md5 );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            ALLOC( ripemd160 );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            ALLOC( sha1 );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
        case MBEDTLS_MD_SHA256:
            ALLOC( sha256 );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
#endif
        case MBEDTLS_MD_SHA512:
            ALLOC( sha512 );
            break;
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    if( hmac != 0 )
    {
        ctx->hmac_ctx = mbedtls_calloc( 2, md_info->block_size );
        if( ctx->hmac_ctx == NULL )
        {
            mbedtls_md_free( ctx );
            return( MBEDTLS_ERR_MD_ALLOC_FAILED );
        }
    }

    ctx->md_info = md_info;

    return( 0 );
}